

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

FastPattern *
trieste::detail::FastPattern::match_opt(FastPattern *__return_storage_ptr__,FastPattern *pattern)

{
  bool bVar1;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_78;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_48;
  FastPattern *local_18;
  FastPattern *pattern_local;
  
  local_18 = pattern;
  pattern_local = __return_storage_ptr__;
  bVar1 = any_first(pattern);
  if (bVar1) {
    FastPattern(__return_storage_ptr__,local_18);
  }
  else {
    CLI::std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
              (&local_48,&local_18->starts);
    local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_78._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_78._M_t._M_impl._0_8_ = 0;
    local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_78._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    CLI::std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
              (&local_78);
    FastPattern(__return_storage_ptr__,&local_48,&local_78,true);
    CLI::std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::~set
              (&local_78);
    CLI::std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::~set
              (&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

static FastPattern match_opt(const FastPattern& pattern)
      {
        if (pattern.any_first())
          return pattern;

        return FastPattern(pattern.starts, {}, true);
      }